

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O1

int fekete_order_num(int rule)

{
  uint suborder_num;
  int *piVar1;
  ulong uVar2;
  int iVar3;
  
  suborder_num = fekete_suborder_num(rule);
  piVar1 = fekete_suborder(rule,suborder_num);
  uVar2 = 0;
  iVar3 = 0;
  do {
    iVar3 = iVar3 + piVar1[uVar2];
    uVar2 = uVar2 + 1;
  } while (suborder_num != uVar2);
  operator_delete__(piVar1);
  return iVar3;
}

Assistant:

int fekete_order_num ( int rule )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_ORDER_NUM returns the order of a Fekete rule for the triangle.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Output, int FEKETE_ORDER_NUM, the order (number of points) of the rule.
//
{
  int order;
  int order_num;
  int *suborder;
  int suborder_num;

  suborder_num = fekete_suborder_num ( rule );

  suborder = fekete_suborder ( rule, suborder_num );

  order_num = 0;
  for ( order = 0; order < suborder_num; order++ )
  {
    order_num = order_num + suborder[order];
  }

  delete [] suborder;

  return order_num;
}